

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode
GetEndpoints(UA_Client *client,size_t *endpointDescriptionsSize,
            UA_EndpointDescription **endpointDescriptions)

{
  UA_Logger logger;
  char *pcVar1;
  UA_StatusCode retval;
  undefined1 local_168 [8];
  UA_GetEndpointsRequest request;
  UA_StatusCode local_bc;
  size_t local_40;
  UA_EndpointDescription *pUStack_38;
  
  memset(local_168,0,0xa0);
  request.requestHeader.authenticationToken.identifier.string.data = (UA_Byte *)UA_DateTime_now();
  request.requestHeader.auditEntryId.data._0_4_ = 10000;
  request.requestHeader.additionalHeader.content.encoded.body.data =
       (UA_Byte *)(client->endpointUrl).length;
  request.endpointUrl.length = (size_t)(client->endpointUrl).data;
  memset(&request.profileUris,0,0x98);
  __UA_Client_Service(client,local_168,UA_TYPES + 0x6e,&request.profileUris,UA_TYPES + 0x9c);
  if (local_bc == 0) {
    *endpointDescriptions = pUStack_38;
    *endpointDescriptionsSize = local_40;
  }
  else {
    logger = (client->config).logger;
    pcVar1 = UA_StatusCode_name(local_bc);
    UA_LOG_ERROR(logger,UA_LOGCATEGORY_CLIENT,"GetEndpointRequest failed with error code %s",pcVar1)
    ;
  }
  UA_GetEndpointsResponse_deleteMembers((UA_GetEndpointsResponse *)&request.profileUris);
  return local_bc;
}

Assistant:

static UA_StatusCode
GetEndpoints(UA_Client *client, size_t* endpointDescriptionsSize,
             UA_EndpointDescription** endpointDescriptions) {
    UA_GetEndpointsRequest request;
    UA_GetEndpointsRequest_init(&request);
    request.requestHeader.timestamp = UA_DateTime_now();
    request.requestHeader.timeoutHint = 10000;
    // assume the endpointurl outlives the service call
    request.endpointUrl = client->endpointUrl; 

    UA_GetEndpointsResponse response;
    UA_GetEndpointsResponse_init(&response);
    __UA_Client_Service(client, &request, &UA_TYPES[UA_TYPES_GETENDPOINTSREQUEST],
                        &response, &UA_TYPES[UA_TYPES_GETENDPOINTSRESPONSE]);

    if(response.responseHeader.serviceResult != UA_STATUSCODE_GOOD) {
        UA_StatusCode retval = response.responseHeader.serviceResult;
        UA_LOG_ERROR(client->config.logger, UA_LOGCATEGORY_CLIENT,
                     "GetEndpointRequest failed with error code %s",
                     UA_StatusCode_name(retval));
        UA_GetEndpointsResponse_deleteMembers(&response);
        return retval;
    }
    *endpointDescriptions = response.endpoints;
    *endpointDescriptionsSize = response.endpointsSize;
    response.endpoints = NULL;
    response.endpointsSize = 0;
    UA_GetEndpointsResponse_deleteMembers(&response);
    return UA_STATUSCODE_GOOD;
}